

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_gsl.cpp
# Opt level: O0

void __thiscall
GslSpan_FromDynamicArrayConstructor_Test::~GslSpan_FromDynamicArrayConstructor_Test
          (GslSpan_FromDynamicArrayConstructor_Test *this)

{
  GslSpan_FromDynamicArrayConstructor_Test *this_local;
  
  ~GslSpan_FromDynamicArrayConstructor_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST (GslSpan, FromDynamicArrayConstructor) {
    double (*arr)[3][4] = new double[100][3][4];

    {
        span<double> s (&arr[0][0][0], 10);
        EXPECT_EQ (s.length (), 10);
        EXPECT_EQ (s.data (), &arr[0][0][0]);
    }
    {
        auto s = make_span (&arr[0][0][0], 10);
        EXPECT_EQ (s.length (), 10);
        EXPECT_EQ (s.data (), &arr[0][0][0]);
    }

    delete[] arr;
}